

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

bool __thiscall
ON__LayerExtensions::Read(ON__LayerExtensions *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  uint uVar2;
  ON_Object *p;
  ON__LayerPerViewSettings *pOVar3;
  int local_40;
  ON__INT32 local_3c;
  int i;
  int count;
  ON_Layer *layer;
  int local_28;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *binary_archive_local;
  ON__LayerExtensions *this_local;
  
  _minor_version = binary_archive;
  binary_archive_local = (ON_BinaryArchive *)this;
  ON_SimpleArray<ON__LayerPerViewSettings>::SetCount(&this->m_vp_settings,0);
  iStack_24 = 0;
  local_28 = 0;
  layer._7_1_ = ON_BinaryArchive::BeginRead3dmChunk
                          (_minor_version,0x40008000,&stack0xffffffffffffffdc,&local_28);
  if ((bool)layer._7_1_) {
    p = ON_UserData::Owner(&this->super_ON_UserData);
    _i = ON_Layer::Cast(p);
    layer._7_1_ = _i != (ON_Layer *)0x0;
    if (((bool)layer._7_1_) && (layer._7_1_ = iStack_24 == 1, (bool)layer._7_1_)) {
      local_3c = 0;
      layer._7_1_ = ON_BinaryArchive::ReadInt(_minor_version,&local_3c);
      if ((bool)layer._7_1_) {
        ON_SimpleArray<ON__LayerPerViewSettings>::Reserve(&this->m_vp_settings,(long)local_3c);
        for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
          pOVar3 = ON_SimpleArray<ON__LayerPerViewSettings>::AppendNew(&this->m_vp_settings);
          layer._7_1_ = ON__LayerPerViewSettings::Read(pOVar3,_i,_minor_version);
          if (!(bool)layer._7_1_) {
            ON_SimpleArray<ON__LayerPerViewSettings>::Remove(&this->m_vp_settings);
            break;
          }
          pOVar3 = ON_SimpleArray<ON__LayerPerViewSettings>::Last(&this->m_vp_settings);
          uVar2 = ON__LayerPerViewSettings::SettingsMask(pOVar3);
          if (uVar2 == 0) {
            ON_SimpleArray<ON__LayerPerViewSettings>::Remove(&this->m_vp_settings);
          }
        }
        ON_SimpleArray<ON__LayerPerViewSettings>::QuickSort
                  (&this->m_vp_settings,ON__LayerPerViewSettings::Compare);
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      layer._7_1_ = 0;
    }
    this_local._7_1_ = (bool)(layer._7_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON__LayerExtensions::Read(ON_BinaryArchive& binary_archive)
{
  m_vp_settings.SetCount(0);

  int major_version = 0;
  int minor_version = 0;
  bool rc = binary_archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if ( !rc )
    return false;

  for(;;)
  {
    const ON_Layer* layer = ON_Layer::Cast( Owner() );
    rc = ( 0 != layer );
    if (!rc) break;

    rc = (1 == major_version);
    if (!rc) break;

    int count = 0;
    rc = binary_archive.ReadInt(&count);
    if ( !rc ) break;
    m_vp_settings.Reserve(count);
    for ( int i = 0; i < count; i++ )
    {
      rc = m_vp_settings.AppendNew().Read(*layer,binary_archive);
      if (!rc) 
      {
        m_vp_settings.Remove();
        break;
      }
      if ( 0 == m_vp_settings.Last()->SettingsMask() )
        m_vp_settings.Remove();
    }

    // to make ON_Layer::PerViewportSettingsCRC() return
    // equal values for equal settings, it is critical
    // that m_vp_settings[] be sorted.
    m_vp_settings.QuickSort(ON__LayerPerViewSettings::Compare);

    if (!rc) break;

    break;
  }

  if ( !binary_archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}